

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

Bool prvTidyInlineDup1(TidyDocImpl *doc,Node *node,Node *element)

{
  Lexer *pLVar1;
  long lVar2;
  Bool BVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  BVar3 = no;
  if ((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) {
    pLVar1 = doc->lexer;
    uVar4 = pLVar1->istacksize - pLVar1->istackbase;
    if (0 < (int)uVar4) {
      iVar5 = uVar4 + 1;
      lVar2 = (ulong)uVar4 << 5;
      do {
        lVar6 = lVar2;
        iVar5 = iVar5 + -1;
        if (iVar5 < 1) {
          return no;
        }
        lVar2 = lVar6 + -0x20;
      } while (*(Dict **)((long)pLVar1->istack + lVar6 + -0x18) != element->tag);
      pLVar1->insert = (IStack *)((long)&pLVar1->istack[-1].next + lVar6);
      pLVar1->inode = node;
      BVar3 = yes;
    }
  }
  return BVar3;
}

Assistant:

Bool TY_(InlineDup1)( TidyDocImpl* doc, Node* node, Node* element )
{
    Lexer* lexer = doc->lexer;
    int n, i;
    if ( element
         && (element->tag != NULL)
         && ((n = lexer->istacksize - lexer->istackbase) > 0) )
    {
        for ( i = n - 1; i >=0; --i ) {
            if (lexer->istack[i].tag == element->tag) {
                /* found our element tag - insert it */
                lexer->insert = &(lexer->istack[i]);
                lexer->inode = node;
                return yes;
            }
        }
    }
    return no;
}